

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O2

void init_streamclass(HSQUIRRELVM v)

{
  undefined8 uVar1;
  long lVar2;
  
  sq_pushregistrytable();
  sq_pushstring(v,"std_stream",0xffffffffffffffff);
  lVar2 = sq_get(v,0xfffffffffffffffe);
  if (lVar2 < 0) {
    sq_pushstring(v,"std_stream",0xffffffffffffffff);
    sq_newclass(v,0);
    sq_settypetag(v,0xffffffffffffffff,0x80000000);
    for (lVar2 = 0x18; lVar2 != 0x158; lVar2 = lVar2 + 0x20) {
      uVar1 = *(undefined8 *)((long)&mathlib_funcs[0x12].nparamscheck + lVar2);
      sq_pushstring(v,*(undefined8 *)((long)&mathlib_funcs[0x12].f + lVar2),0xffffffffffffffff);
      sq_newclosure(v,uVar1,0);
      sq_setparamscheck(v,*(undefined8 *)((long)&mathlib_funcs[0x12].typemask + lVar2),
                        *(undefined8 *)((long)&_stream_methods[0].name + lVar2));
      sq_newslot(v,0xfffffffffffffffd,0);
    }
    sq_newslot(v,0xfffffffffffffffd,0);
    sq_pushroottable(v);
    sq_pushstring(v,"stream",0xffffffffffffffff);
    sq_pushstring(v,"std_stream",0xffffffffffffffff);
    sq_get(v,0xfffffffffffffffc);
    sq_newslot(v,0xfffffffffffffffd,0);
  }
  sq_pop(v,1);
  sq_pop(v,1);
  return;
}

Assistant:

void init_streamclass(HSQUIRRELVM v)
{
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_FAILED(sq_get(v,-2))) {
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_newclass(v,SQFalse);
        sq_settypetag(v,-1,(SQUserPointer)((SQUnsignedInteger)SQSTD_STREAM_TYPE_TAG));
        SQInteger i = 0;
        while(_stream_methods[i].name != 0) {
            const SQRegFunction &f = _stream_methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pushroottable(v);
        sq_pushstring(v,_SC("stream"),-1);
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_get(v,-4);
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);
    }
    else {
        sq_pop(v,1); //result
    }
    sq_pop(v,1);
}